

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

matrix3f * __thiscall tinyusdz::value::matrix3f::operator=(matrix3f *this,matrix3d *src)

{
  matrix3f *pmVar1;
  size_t j;
  long lVar2;
  long lVar3;
  
  pmVar1 = this;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      (*(float (*) [3])*(float (*) [3])this)[lVar3] =
           (float)(*(double (*) [3])*(double (*) [3])src)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    src = (matrix3d *)((long)src + 0x18);
    this = (matrix3f *)((long)this + 0xc);
  } while (lVar2 != 3);
  return pmVar1;
}

Assistant:

matrix3f &matrix3f::operator=(const matrix3d &src) {

  for (size_t j = 0; j < 3; j++) {
    for (size_t i = 0; i < 3; i++) {
      m[j][i] = float(src.m[j][i]);
    }
  }

  return *this;
}